

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::TextureMultisampleTests::init
          (TextureMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  Context *ctx_00;
  int extraout_EAX;
  TestNode *pTVar1;
  char *pcVar2;
  SamplePosRasterizationTest *this_00;
  SampleMaskCase *pSVar3;
  MultisampleTextureUsageCase *this_01;
  NegativeFramebufferCase *pNVar4;
  NegativeTexParameterCase *pNVar5;
  NegativeTexureSampleCase *pNVar6;
  TestCaseGroup *negativeGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  int local_a0;
  undefined1 local_99;
  int typeNdx;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  TestNode *local_20;
  TestCaseGroup *sampleGroup;
  TextureMultisampleTests *pTStack_10;
  int sampleNdx;
  TextureMultisampleTests *this_local;
  
  pTStack_10 = this;
  for (sampleGroup._4_4_ = 0; sampleGroup._4_4_ < 10; sampleGroup._4_4_ = sampleGroup._4_4_ + 1) {
    pTVar1 = (TestNode *)operator_new(0x70);
    local_99 = 1;
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"samples_",&local_61);
    de::toString<int>((string *)&typeNdx,init::sampleCounts + sampleGroup._4_4_);
    std::operator+(&local_40,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&typeNdx);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,testCtx,pcVar2,"Test with N samples");
    local_99 = 0;
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&typeNdx);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    local_20 = pTVar1;
    tcu::TestNode::addChild((TestNode *)this,pTVar1);
    pTVar1 = local_20;
    this_00 = (SamplePosRasterizationTest *)operator_new(0xe8);
    anon_unknown_1::SamplePosRasterizationTest::SamplePosRasterizationTest
              (this_00,(this->super_TestCaseGroup).m_context,"sample_position",
               "test SAMPLE_POSITION",init::sampleCounts[sampleGroup._4_4_]);
    tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
    pTVar1 = local_20;
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_only",
               "Test with SampleMask only",init::sampleCounts[sampleGroup._4_4_],0);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pSVar3);
    pTVar1 = local_20;
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_and_alpha_to_coverage",
               "Test with SampleMask and alpha to coverage",init::sampleCounts[sampleGroup._4_4_],1)
    ;
    tcu::TestNode::addChild(pTVar1,(TestNode *)pSVar3);
    pTVar1 = local_20;
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_and_sample_coverage",
               "Test with SampleMask and sample coverage",init::sampleCounts[sampleGroup._4_4_],2);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pSVar3);
    pTVar1 = local_20;
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,
               "sample_mask_and_sample_coverage_and_alpha_to_coverage",
               "Test with SampleMask, sample coverage, and alpha to coverage",
               init::sampleCounts[sampleGroup._4_4_],3);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pSVar3);
    pTVar1 = local_20;
    pSVar3 = (SampleMaskCase *)operator_new(0xd0);
    anon_unknown_1::SampleMaskCase::SampleMaskCase
              (pSVar3,(this->super_TestCaseGroup).m_context,"sample_mask_non_effective_bits",
               "Test with SampleMask, set higher bits than sample count",
               init::sampleCounts[sampleGroup._4_4_],4);
    tcu::TestNode::addChild(pTVar1,(TestNode *)pSVar3);
    for (local_a0 = 0; pTVar1 = local_20, local_a0 < 8; local_a0 = local_a0 + 1) {
      this_01 = (MultisampleTextureUsageCase *)operator_new(0xa0);
      negativeGroup._6_1_ = 1;
      ctx_00 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"use_",(allocator<char> *)((long)&negativeGroup + 7));
      std::operator+(&local_c0,&local_e0,init::textureTypes[local_a0].name);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      anon_unknown_1::MultisampleTextureUsageCase::MultisampleTextureUsageCase
                (this_01,ctx_00,pcVar2,init::textureTypes[local_a0].name,
                 init::sampleCounts[sampleGroup._4_4_],init::textureTypes[local_a0].type);
      negativeGroup._6_1_ = 0;
      tcu::TestNode::addChild(pTVar1,(TestNode *)this_01);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&negativeGroup + 7));
    }
  }
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Negative tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pNVar4 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar4,(this->super_TestCaseGroup).m_context,
             "fbo_attach_different_sample_count_tex_tex","Attach different sample counts",
             CASE_DIFFERENT_N_SAMPLES_TEX);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar4);
  pNVar4 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar4,(this->super_TestCaseGroup).m_context,
             "fbo_attach_different_sample_count_tex_rbo","Attach different sample counts",
             CASE_DIFFERENT_N_SAMPLES_RBO);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar4);
  pNVar4 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar4,(this->super_TestCaseGroup).m_context,"fbo_attach_different_fixed_state_tex_tex"
             ,"Attach fixed and non fixed",CASE_DIFFERENT_FIXED_TEX);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar4);
  pNVar4 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar4,(this->super_TestCaseGroup).m_context,"fbo_attach_different_fixed_state_tex_rbo"
             ,"Attach fixed and non fixed",CASE_DIFFERENT_FIXED_RBO);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar4);
  pNVar4 = (NegativeFramebufferCase *)operator_new(0x90);
  anon_unknown_1::NegativeFramebufferCase::NegativeFramebufferCase
            (pNVar4,(this->super_TestCaseGroup).m_context,"fbo_attach_non_zero_level",
             "Attach non-zero level",CASE_NON_ZERO_LEVEL);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar4);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_min_filter",
             "set TEXTURE_MIN_FILTER",TEXTURE_MIN_FILTER);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_mag_filter",
             "set TEXTURE_MAG_FILTER",TEXTURE_MAG_FILTER);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_wrap_s","set TEXTURE_WRAP_S",
             TEXTURE_WRAP_S);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_wrap_t","set TEXTURE_WRAP_T",
             TEXTURE_WRAP_T);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_wrap_r","set TEXTURE_WRAP_R",
             TEXTURE_WRAP_R);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_min_lod","set TEXTURE_MIN_LOD",
             TEXTURE_MIN_LOD);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_max_lod","set TEXTURE_MAX_LOD",
             TEXTURE_MAX_LOD);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_compare_mode",
             "set TEXTURE_COMPARE_MODE",TEXTURE_COMPARE_MODE);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_compare_func",
             "set TEXTURE_COMPARE_FUNC",TEXTURE_COMPARE_FUNC);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar5 = (NegativeTexParameterCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexParameterCase::NegativeTexParameterCase
            (pNVar5,(this->super_TestCaseGroup).m_context,"texture_base_level",
             "set TEXTURE_BASE_LEVEL",TEXTURE_BASE_LEVEL);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar5);
  pNVar6 = (NegativeTexureSampleCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexureSampleCase::NegativeTexureSampleCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_high_sample_count",
             "TexStorage with high numSamples",SAMPLECOUNT_HIGH);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar6);
  pNVar6 = (NegativeTexureSampleCase *)operator_new(0x80);
  anon_unknown_1::NegativeTexureSampleCase::NegativeTexureSampleCase
            (pNVar6,(this->super_TestCaseGroup).m_context,"texture_zero_sample_count",
             "TexStorage with zero numSamples",SAMPLECOUNT_ZERO);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pNVar6);
  return extraout_EAX;
}

Assistant:

void TextureMultisampleTests::init (void)
{
	static const int sampleCounts[] = { 1, 2, 3, 4, 8, 10, 12, 13, 16, 64 };

	static const struct TextureType
	{
		const char*									name;
		MultisampleTextureUsageCase::TextureType	type;
	} textureTypes[] =
	{
		{ "texture_color_2d",		MultisampleTextureUsageCase::TEXTURE_COLOR_2D		},
		{ "texture_color_2d_array",	MultisampleTextureUsageCase::TEXTURE_COLOR_2D_ARRAY	},
		{ "texture_int_2d",			MultisampleTextureUsageCase::TEXTURE_INT_2D			},
		{ "texture_int_2d_array",	MultisampleTextureUsageCase::TEXTURE_INT_2D_ARRAY	},
		{ "texture_uint_2d",		MultisampleTextureUsageCase::TEXTURE_UINT_2D		},
		{ "texture_uint_2d_array",	MultisampleTextureUsageCase::TEXTURE_UINT_2D_ARRAY	},
		{ "texture_depth_2d",		MultisampleTextureUsageCase::TEXTURE_DEPTH_2D		},
		{ "texture_depth_2d_array",	MultisampleTextureUsageCase::TEXTURE_DEPTH_2D_ARRAY	},
	};

	// .samples_x
	for (int sampleNdx = 0; sampleNdx < DE_LENGTH_OF_ARRAY(sampleCounts); ++sampleNdx)
	{
		tcu::TestCaseGroup* const sampleGroup = new tcu::TestCaseGroup(m_testCtx, (std::string("samples_") + de::toString(sampleCounts[sampleNdx])).c_str(), "Test with N samples");
		addChild(sampleGroup);

		// position query works
		sampleGroup->addChild(new SamplePosRasterizationTest(m_context, "sample_position", "test SAMPLE_POSITION", sampleCounts[sampleNdx]));

		// sample mask is ANDed properly
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_only",											"Test with SampleMask only",									sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_NONE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_alpha_to_coverage",						"Test with SampleMask and alpha to coverage",					sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage",							"Test with SampleMask and sample coverage",						sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_SAMPLE_COVERAGE));
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_and_sample_coverage_and_alpha_to_coverage",	"Test with SampleMask, sample coverage, and alpha to coverage",	sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_ALPHA_TO_COVERAGE | SampleMaskCase::FLAGS_SAMPLE_COVERAGE));

		// high bits cause no unexpected behavior
		sampleGroup->addChild(new SampleMaskCase(m_context, "sample_mask_non_effective_bits",							"Test with SampleMask, set higher bits than sample count",		sampleCounts[sampleNdx],	SampleMaskCase::FLAGS_HIGH_BITS));

		// usage
		for (int typeNdx = 0; typeNdx < DE_LENGTH_OF_ARRAY(textureTypes); ++typeNdx)
			sampleGroup->addChild(new MultisampleTextureUsageCase(m_context, (std::string("use_") + textureTypes[typeNdx].name).c_str(), textureTypes[typeNdx].name, sampleCounts[sampleNdx], textureTypes[typeNdx].type));
	}

	// .negative
	{
		tcu::TestCaseGroup* const negativeGroup = new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests");
		addChild(negativeGroup);

		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_tex",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_sample_count_tex_rbo",	"Attach different sample counts",	NegativeFramebufferCase::CASE_DIFFERENT_N_SAMPLES_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_tex",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_TEX));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_different_fixed_state_tex_rbo",		"Attach fixed and non fixed",		NegativeFramebufferCase::CASE_DIFFERENT_FIXED_RBO));
		negativeGroup->addChild(new NegativeFramebufferCase	(m_context, "fbo_attach_non_zero_level",					"Attach non-zero level",			NegativeFramebufferCase::CASE_NON_ZERO_LEVEL));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_filter",							"set TEXTURE_MIN_FILTER",			NegativeTexParameterCase::TEXTURE_MIN_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_mag_filter",							"set TEXTURE_MAG_FILTER",			NegativeTexParameterCase::TEXTURE_MAG_FILTER));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_s",								"set TEXTURE_WRAP_S",				NegativeTexParameterCase::TEXTURE_WRAP_S));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_t",								"set TEXTURE_WRAP_T",				NegativeTexParameterCase::TEXTURE_WRAP_T));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_wrap_r",								"set TEXTURE_WRAP_R",				NegativeTexParameterCase::TEXTURE_WRAP_R));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_min_lod",								"set TEXTURE_MIN_LOD",				NegativeTexParameterCase::TEXTURE_MIN_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_max_lod",								"set TEXTURE_MAX_LOD",				NegativeTexParameterCase::TEXTURE_MAX_LOD));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_mode",							"set TEXTURE_COMPARE_MODE",			NegativeTexParameterCase::TEXTURE_COMPARE_MODE));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_compare_func",							"set TEXTURE_COMPARE_FUNC",			NegativeTexParameterCase::TEXTURE_COMPARE_FUNC));
		negativeGroup->addChild(new NegativeTexParameterCase(m_context, "texture_base_level",							"set TEXTURE_BASE_LEVEL",			NegativeTexParameterCase::TEXTURE_BASE_LEVEL));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_high_sample_count",					"TexStorage with high numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_HIGH));
		negativeGroup->addChild(new NegativeTexureSampleCase(m_context, "texture_zero_sample_count",					"TexStorage with zero numSamples",	NegativeTexureSampleCase::SAMPLECOUNT_ZERO));
	}
}